

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall
QDockWidgetPrivate::nonClientAreaMouseEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  short sVar1;
  Representation RVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  DragState *pDVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  QStyle *pQVar9;
  QWidget *this_01;
  ulong uVar10;
  long lVar11;
  undefined4 uVar12;
  uint uVar13;
  ulong uVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QRect QVar19;
  undefined1 auVar20 [16];
  QPoint local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  long local_38;
  QWidgetData *pQVar14;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar9 = QWidget::style(this_00);
  iVar8 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x12,0,this_00);
  this_01 = QWidget::window(this_00);
  pQVar14 = this_01->data;
  RVar2.m_i = (pQVar14->crect).x1.m_i;
  iVar3 = (pQVar14->crect).y1.m_i;
  iVar4 = (pQVar14->crect).x2.m_i;
  uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QVar19 = QWidget::frameGeometry(this_01);
  uVar12 = SUB84(pQVar14,0);
  stack0xffffffffffffffbc = QVar19._4_12_;
  local_48._0_4_ = RVar2.m_i;
  uStack_40._0_4_ = iVar4;
  uStack_40._4_4_ = iVar3 + -1;
  auVar18 = _local_48;
  local_48._4_4_ = QVar19.y1.m_i;
  uStack_40 = auVar18._8_8_;
  local_48._4_4_ = local_48._4_4_ + iVar8;
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0xad) {
    pDVar5 = this->state;
    if (((pDVar5 != (DragState *)0x0) && (pDVar5->dragging == true)) && (pDVar5->nca == true)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        endDrag(this,LocationChange);
        return;
      }
      goto LAB_004088aa;
    }
  }
  else {
    if (sVar1 == 0xb0) {
      lVar11 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        setFloating(*(QDockWidgetPrivate **)(lVar11 + 8),
                    (*(byte *)(*(long *)(lVar11 + 0x20) + 0xc) & 1) == 0);
        return;
      }
      goto LAB_004088aa;
    }
    if (sVar1 == 0xae) {
      auVar20 = QEventPoint::globalPosition();
      auVar18._0_8_ =
           (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._8_8_;
      auVar18._8_8_ =
           (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._0_8_;
      auVar18 = minpd(_DAT_0066f5d0,auVar18);
      auVar20._8_8_ = -(ulong)(-2147483648.0 < auVar18._8_8_);
      auVar20._0_8_ = -(ulong)(-2147483648.0 < auVar18._0_8_);
      uVar13 = movmskpd(uVar12,auVar20);
      uVar15 = (ulong)(uint)(int)auVar18._8_8_;
      uVar10 = (ulong)(uint)(int)auVar18._0_8_ << 0x20;
      if ((uVar13 & 1) == 0) {
        uVar10 = 0x8000000000000000;
      }
      if ((uVar13 & 2) == 0) {
        uVar15 = 0x80000000;
      }
      local_50 = (QPoint)(uVar15 | uVar10);
      cVar6 = QRect::contains((QPoint *)local_48,SUB81(&local_50,0));
      if ((cVar6 != '\0') && (this->state == (DragState *)0x0)) {
        lVar11 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
        if (lVar11 == 0) {
          lVar11 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
          if (lVar11 == 0) goto LAB_0040888b;
        }
        bVar7 = isAnimating(this);
        if (!bVar7) {
          auVar18 = QEventPoint::position();
          auVar16._0_8_ =
               (double)((ulong)auVar18._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar18._8_8_;
          auVar16._8_8_ =
               (double)((ulong)auVar18._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar18._0_8_;
          auVar18 = minpd(_DAT_0066f5d0,auVar16);
          auVar17._8_8_ = -(ulong)(-2147483648.0 < auVar18._8_8_);
          auVar17._0_8_ = -(ulong)(-2147483648.0 < auVar18._0_8_);
          uVar13 = movmskpd(uVar13,auVar17);
          uVar10 = 0x8000000000000000;
          if ((uVar13 & 1) != 0) {
            uVar10 = (ulong)(uint)(int)auVar18._0_8_ << 0x20;
          }
          uVar15 = 0x80000000;
          if ((uVar13 & 2) != 0) {
            uVar15 = (ulong)(uint)(int)auVar18._8_8_;
          }
          local_50 = (QPoint)(uVar15 | uVar10);
          initDrag(this,&local_50,true);
          if (this->state != (DragState *)0x0) {
            bVar7 = true;
            if (((byte)event[0x23] & 4) == 0) {
              if (((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                   super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 2) == 0) {
                bVar7 = (bool)((byte)(this_00->data->window_flags).
                                     super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                     super_QFlagsStorage<Qt::WindowType>.i & 1);
              }
              else {
                bVar7 = false;
              }
            }
            this->state->ctrlDrag = bVar7;
            startDrag(this,Group);
          }
        }
      }
    }
  }
LAB_0040888b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004088aa:
  __stack_chk_fail();
}

Assistant:

void QDockWidgetPrivate::nonClientAreaMouseEvent(QMouseEvent *event)
{
    Q_Q(QDockWidget);

    int fw = q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q);

    QWidget *tl = q->topLevelWidget();
    QRect geo = tl->geometry();
    QRect titleRect = tl->frameGeometry();
    {
        titleRect.setLeft(geo.left());
        titleRect.setRight(geo.right());
        titleRect.setBottom(geo.top() - 1);
        titleRect.adjust(0, fw, 0, 0);
    }

    switch (event->type()) {
        case QEvent::NonClientAreaMouseButtonPress:
            if (!titleRect.contains(event->globalPosition().toPoint()))
                break;
            if (state != nullptr)
                break;
            if (qobject_cast<QMainWindow*>(parent) == nullptr && qobject_cast<QDockWidgetGroupWindow*>(parent) == nullptr)
                break;
            if (isAnimating())
                break;
            initDrag(event->position().toPoint(), true);
            if (state == nullptr)
                break;
            state->ctrlDrag = (event->modifiers() & Qt::ControlModifier) ||
                              (!hasFeature(this, QDockWidget::DockWidgetMovable) && q->isFloating());
            startDrag(DragScope::Group);
            break;
        case QEvent::NonClientAreaMouseMove:
            if (state == nullptr || !state->dragging)
                break;

#if !defined(Q_OS_MAC) && !defined(Q_OS_WASM)
            if (state->nca)
                endDrag(EndDragMode::LocationChange);
#endif
            break;
        case QEvent::NonClientAreaMouseButtonRelease:
#if defined(Q_OS_MAC) || defined(Q_OS_WASM)
                        if (state)
                            endDrag(EndDragMode::LocationChange);
#endif
                        break;
        case QEvent::NonClientAreaMouseButtonDblClick:
            toggleTopLevel();
            break;
        default:
            break;
    }
}